

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# lj_err.c
# Opt level: O1

void lj_err_run(lua_State *L)

{
  uint *puVar1;
  uint uVar2;
  TValue *pTVar3;
  GCstr *pGVar4;
  TValue *pTVar5;
  void *pvVar6;
  long lVar7;
  
  pTVar5 = L->base + -1;
  pTVar3 = (TValue *)(ulong)(L->stack).ptr32;
  pvVar6 = L->cframe;
  if (pvVar6 == (void *)0x0 || pTVar5 <= pTVar3) {
LAB_0010a449:
    lVar7 = 0;
LAB_0010a44b:
    if (lVar7 != 0) {
      pTVar5 = L->top;
      puVar1 = (uint *)((ulong)(L->glref).ptr32 + 0x254);
      *puVar1 = *puVar1 & 0xffffffef;
      if ((*(int *)((long)pTVar3 + lVar7 + 4) != -9) || (L->status == '\x05')) {
        pGVar4 = lj_err_str(L,LJ_ERR_ERRERR);
        pTVar5[-1].u32.lo = (uint32_t)pGVar4;
        *(undefined4 *)((long)pTVar5 + -4) = 0xfffffffb;
        lj_err_throw(L,5);
      }
      L->status = '\x05';
      *pTVar5 = pTVar5[-1];
      pTVar5[-1] = *(TValue *)((long)pTVar3 + lVar7);
      L->top = pTVar5 + 1;
      lj_vm_call(L,pTVar5,2);
    }
    lj_err_throw(L,2);
  }
LAB_0010a397:
  do {
    if ((*(int *)(((ulong)pvVar6 & 0xfffffffffffffffc) + 0x10) < 0) &&
       (pTVar5 < (TValue *)((long)pTVar3 - (long)*(int *)((long)pvVar6 + 0x10)))) {
      lVar7 = (long)*(int *)((long)pvVar6 + 0x14);
      if (lVar7 < 0) break;
      goto LAB_0010a44b;
    }
    uVar2 = (pTVar5->field_2).it;
    switch(uVar2 & 7) {
    default:
      pTVar5 = pTVar5 + (-1 - (ulong)*(byte *)((ulong)uVar2 - 3));
      goto LAB_0010a423;
    case 1:
      pvVar6 = *(void **)((long)pvVar6 + 0x20);
      break;
    case 2:
      if (pTVar5[-1].u32.lo == 1) {
        pvVar6 = *(void **)((long)pvVar6 + 0x20);
      }
      pTVar5 = (TValue *)((long)pTVar5 - (long)(int)(uVar2 & 0xfffffff8));
      goto LAB_0010a423;
    case 3:
      break;
    case 5:
      if (((ulong)pvVar6 & 1) != 0) goto LAB_0010a449;
      lVar7 = (long)*(int *)((long)pvVar6 + 0x14);
      if (-1 < lVar7) goto LAB_0010a44b;
      break;
    case 6:
    case 7:
      if (0xf < (int)uVar2) {
        lVar7 = (long)pTVar5 + (-8 - (long)pTVar3);
        goto LAB_0010a44b;
      }
      goto LAB_0010a449;
    }
    pTVar5 = (TValue *)((long)pTVar5 - ((long)(int)uVar2 & 0xfffffffffffffff8U));
LAB_0010a423:
    if (pTVar5 <= pTVar3) goto LAB_0010a449;
    lVar7 = 0;
    if (pvVar6 == (void *)0x0) goto LAB_0010a44b;
  } while( true );
  pvVar6 = *(void **)((long)pvVar6 + 0x20);
  if (pvVar6 == (void *)0x0) goto LAB_0010a449;
  goto LAB_0010a397;
}

Assistant:

LJ_NOINLINE void lj_err_run(lua_State *L)
{
  ptrdiff_t ef = finderrfunc(L);
  if (ef) {
    TValue *errfunc = restorestack(L, ef);
    TValue *top = L->top;
    lj_trace_abort(G(L));
    if (!tvisfunc(errfunc) || L->status == LUA_ERRERR) {
      setstrV(L, top-1, lj_err_str(L, LJ_ERR_ERRERR));
      lj_err_throw(L, LUA_ERRERR);
    }
    L->status = LUA_ERRERR;
    copyTV(L, top, top-1);
    copyTV(L, top-1, errfunc);
    L->top = top+1;
    lj_vm_call(L, top, 1+1);  /* Stack: |errfunc|msg| -> |msg| */
  }
  lj_err_throw(L, LUA_ERRRUN);
}